

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  int iVar1;
  cmValue cVar2;
  string *psVar3;
  long lVar4;
  string *name;
  string_view value;
  
  cVar2 = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  if (cVar2.Value != (string *)0x0) {
    iVar1 = atoi(((cVar2.Value)->_M_dataplus)._M_p);
    name = matchVariables_abi_cxx11_;
    for (lVar4 = 0; lVar4 <= iVar1; lVar4 = lVar4 + 1) {
      psVar3 = GetSafeDefinition(this,name);
      if (psVar3->_M_string_length != 0) {
        AddDefinition(this,name,(string_view)(ZEXT816(0x6bb539) << 0x40));
        cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      }
      name = name + 1;
    }
    value._M_str = "0";
    value._M_len = 1;
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,value);
    cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
    return;
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  cmValue nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr) {
    return;
  }
  int nMatches = atoi(nMatchesStr->c_str());
  for (int i = 0; i <= nMatches; i++) {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if (!s.empty()) {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
    }
  }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}